

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

void CheckStopped(AActor *self)

{
  double dVar1;
  player_t *ppVar2;
  
  ppVar2 = self->player;
  if ((((ppVar2 != (player_t *)0x0) && (ppVar2->mo == (APlayerPawn *)self)) &&
      ((ppVar2->cheats & 0x2000) == 0)) &&
     ((((dVar1 = (self->Vel).X, dVar1 != 0.0 || (NAN(dVar1))) ||
       ((dVar1 = (self->Vel).Y, dVar1 != 0.0 ||
        ((NAN(dVar1) || (dVar1 = (self->Vel).Z, dVar1 != 0.0)))))) || (NAN(dVar1))))) {
    APlayerPawn::PlayIdle(ppVar2->mo);
    ppVar2 = self->player;
    (ppVar2->Vel).X = 0.0;
    (ppVar2->Vel).Y = 0.0;
  }
  return;
}

Assistant:

static void CheckStopped(AActor *self)
{
	if (self->player != NULL &&
		self->player->mo == self &&
		!(self->player->cheats & CF_PREDICTING) && !self->Vel.isZero())
	{
		self->player->mo->PlayIdle();
		self->player->Vel.Zero();
	}
}